

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void highbd_dr_prediction_z1_8xN_avx2
               (int N,uint16_t *dst,ptrdiff_t stride,uint16_t *above,int upsample_above,int dx,
               int bd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  ushort uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined8 uVar35;
  uint uVar36;
  long lVar37;
  undefined8 *puVar38;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  uint in_R8D;
  uint in_R9D;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  int in_stack_00000008;
  int i_2;
  __m128i dstvec [32];
  __m128i atmp3;
  __m128i atmp2;
  __m128i atmp1;
  __m128i atmp0;
  __m128i mask;
  int i;
  int base;
  __m256i shift;
  __m256i res1;
  __m256i res;
  __m256i b;
  int r;
  int x;
  __m128i a1_x128;
  __m128i a0_x128;
  __m256i mask256;
  __m256i base_inc256;
  __m256i max_base_x256;
  __m256i diff;
  __m256i a_mbase_x;
  __m256i c3f;
  __m256i a16;
  __m256i a32;
  __m256i a1;
  __m256i a0;
  int max_base_x;
  int frac_bits;
  int i_1;
  int base_1;
  __m256i shift_1;
  __m256i res1_1;
  __m256i res_1;
  __m256i b_1;
  int r_1;
  int x_1;
  __m256i mask256_1;
  __m256i base_inc256_1;
  __m256i max_base_x256_1;
  __m256i diff_1;
  __m256i a_mbase_x_1;
  __m256i a16_1;
  __m256i a32_1;
  __m256i a1_1;
  __m256i a0_1;
  __m256i a1_2;
  __m256i a0_2;
  int max_base_x_1;
  int frac_bits_1;
  int local_17d4;
  undefined8 local_17d0 [70];
  undefined1 local_15a0 [16];
  undefined1 local_1590 [16];
  undefined1 local_1580 [16];
  undefined1 local_1570 [16];
  undefined1 local_1560 [16];
  int local_1548;
  int local_1544;
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  int local_14a8;
  uint local_14a4;
  undefined1 local_14a0 [16];
  undefined1 local_1490 [16];
  undefined1 local_1480 [32];
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined1 local_1420 [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined1 local_13e0 [16];
  undefined1 auStack_13d0 [16];
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined1 local_13a0 [32];
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined1 auStack_1370 [16];
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined1 auStack_1350 [16];
  uint local_1328;
  int local_1324;
  byte local_131c;
  undefined8 *local_1310;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  ushort local_126c;
  ushort local_126a;
  undefined2 local_1268;
  ushort local_1266;
  ushort local_1264;
  undefined2 local_1262;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 local_1210;
  undefined8 uStack_1208;
  uint8_t local_1200 [8];
  uint8_t auStack_11f8 [8];
  undefined8 local_11f0;
  undefined8 uStack_11e8;
  uint8_t local_11e0 [8];
  uint8_t auStack_11d8 [8];
  undefined8 local_11d0;
  undefined8 uStack_11c8;
  uint8_t local_11c0 [8];
  uint8_t auStack_11b8 [8];
  undefined8 local_11b0;
  undefined8 uStack_11a8;
  uint8_t local_11a0 [8];
  uint8_t auStack_1198 [8];
  undefined8 local_1190;
  undefined8 uStack_1188;
  undefined1 local_1180 [16];
  undefined1 auStack_1170 [16];
  undefined2 local_1160;
  undefined2 local_115e;
  undefined2 local_115c;
  undefined2 local_115a;
  undefined2 local_1158;
  undefined2 local_1156;
  undefined2 local_1154;
  undefined2 local_1152;
  undefined2 local_1150;
  undefined2 local_114e;
  undefined2 local_114c;
  undefined2 local_114a;
  undefined2 local_1148;
  undefined2 local_1146;
  undefined2 local_1144;
  undefined2 local_1142;
  undefined1 local_1140 [16];
  undefined1 auStack_1130 [16];
  ushort local_1120;
  ushort local_111e;
  ushort local_111c;
  ushort local_111a;
  ushort local_1118;
  ushort local_1116;
  ushort local_1114;
  ushort local_1112;
  ushort local_1110;
  ushort local_110e;
  ushort local_110c;
  ushort local_110a;
  ushort local_1108;
  ushort local_1106;
  ushort local_1104;
  ushort local_1102;
  undefined1 local_1100 [16];
  undefined1 auStack_10f0 [16];
  ushort local_10e0;
  ushort local_10de;
  ushort local_10dc;
  ushort local_10da;
  ushort local_10d8;
  ushort local_10d6;
  ushort local_10d4;
  ushort local_10d2;
  ushort local_10d0;
  ushort local_10ce;
  ushort local_10cc;
  ushort local_10ca;
  ushort local_10c8;
  ushort local_10c6;
  ushort local_10c4;
  ushort local_10c2;
  undefined1 local_10c0 [32];
  undefined2 local_10a0;
  undefined2 local_109e;
  undefined2 local_109c;
  undefined2 local_109a;
  undefined2 local_1098;
  undefined2 local_1096;
  undefined2 local_1094;
  undefined2 local_1092;
  undefined2 local_1090;
  undefined2 local_108e;
  undefined2 local_108c;
  undefined2 local_108a;
  undefined2 local_1088;
  undefined2 local_1086;
  undefined2 local_1084;
  undefined2 local_1082;
  undefined1 local_1080 [32];
  ushort local_1060;
  ushort local_105e;
  ushort local_105c;
  ushort local_105a;
  ushort local_1058;
  ushort local_1056;
  ushort local_1054;
  ushort local_1052;
  ushort local_1050;
  ushort local_104e;
  ushort local_104c;
  ushort local_104a;
  ushort local_1048;
  ushort local_1046;
  ushort local_1044;
  ushort local_1042;
  undefined1 local_1040 [32];
  ushort local_1020;
  ushort local_101e;
  ushort local_101c;
  ushort local_101a;
  ushort local_1018;
  ushort local_1016;
  ushort local_1014;
  ushort local_1012;
  ushort local_1010;
  ushort local_100e;
  ushort local_100c;
  ushort local_100a;
  ushort local_1008;
  ushort local_1006;
  ushort local_1004;
  ushort local_1002;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined1 local_f80 [16];
  undefined1 auStack_f70 [16];
  undefined1 local_f60 [16];
  undefined1 auStack_f50 [16];
  undefined1 local_f40 [16];
  undefined1 auStack_f30 [16];
  undefined1 local_f20 [32];
  undefined1 (*local_f00) [16];
  undefined1 (*local_ef8) [16];
  undefined1 (*local_ef0) [16];
  undefined4 local_ee4;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined4 local_ea4;
  undefined1 local_ea0 [32];
  undefined4 local_e64;
  undefined1 local_e60 [32];
  undefined4 local_e24;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined1 local_de0 [16];
  undefined1 auStack_dd0 [16];
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 local_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 local_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  int local_d08;
  uint local_d04;
  undefined1 local_d00 [32];
  undefined1 local_ce0 [32];
  undefined1 local_cc0 [32];
  undefined1 local_ca0 [32];
  int local_c68;
  uint local_c64;
  undefined1 local_c60 [32];
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined1 local_c20 [16];
  undefined1 auStack_c10 [16];
  undefined1 local_c00 [32];
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined1 local_ba0 [32];
  undefined1 auStack_b70 [16];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [24];
  undefined8 uStack_b08;
  uint local_ae8;
  int local_ae4;
  undefined8 *local_ad0;
  ushort local_ac2;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 local_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined1 local_a00 [16];
  undefined1 auStack_9f0 [16];
  ushort local_9e0;
  ushort local_9de;
  ushort local_9dc;
  ushort local_9da;
  ushort local_9d8;
  ushort local_9d6;
  ushort local_9d4;
  ushort local_9d2;
  ushort local_9d0;
  ushort local_9ce;
  ushort local_9cc;
  ushort local_9ca;
  ushort local_9c8;
  ushort local_9c6;
  ushort local_9c4;
  ushort local_9c2;
  undefined1 local_9c0 [16];
  undefined1 auStack_9b0 [16];
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined1 local_980 [16];
  undefined1 auStack_970 [16];
  undefined1 local_960 [32];
  undefined1 (*local_940) [16];
  undefined1 (*local_938) [16];
  undefined1 (*local_930) [16];
  undefined4 local_928;
  uint local_924;
  undefined4 local_920;
  uint local_91c;
  uint local_918;
  undefined4 local_914;
  undefined8 local_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined1 local_860 [16];
  undefined1 auStack_850 [16];
  undefined4 local_840;
  undefined4 local_83c;
  undefined4 local_838;
  undefined4 local_834;
  undefined4 local_830;
  undefined4 local_82c;
  undefined4 local_828;
  undefined4 local_824;
  undefined1 local_820 [32];
  uint local_800;
  uint local_7fc;
  uint local_7f8;
  uint local_7f4;
  uint local_7f0;
  uint local_7ec;
  uint local_7e8;
  uint local_7e4;
  undefined1 local_7e0 [16];
  undefined1 auStack_7d0 [16];
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  
  local_131c = (byte)in_R8D;
  if (in_stack_00000008 < 0xc) {
    local_1310 = local_17d0;
    local_1324 = 6 - in_R8D;
    uVar36 = in_EDI + 7 << (local_131c & 0x1f);
    local_1328 = uVar36;
    local_1262 = 0x10;
    local_1142 = 0x10;
    local_1144 = 0x10;
    local_1146 = 0x10;
    local_1148 = 0x10;
    local_114a = 0x10;
    local_114c = 0x10;
    local_114e = 0x10;
    local_1150 = 0x10;
    local_1152 = 0x10;
    local_1154 = 0x10;
    local_1156 = 0x10;
    local_1158 = 0x10;
    local_115a = 0x10;
    local_115c = 0x10;
    local_115e = 0x10;
    local_1160 = 0x10;
    auVar1 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar1 = vpinsrw_avx(auVar1,0x10,2);
    auVar1 = vpinsrw_avx(auVar1,0x10,3);
    auVar1 = vpinsrw_avx(auVar1,0x10,4);
    auVar1 = vpinsrw_avx(auVar1,0x10,5);
    auVar1 = vpinsrw_avx(auVar1,0x10,6);
    auVar1 = vpinsrw_avx(auVar1,0x10,7);
    auVar2 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar2 = vpinsrw_avx(auVar2,0x10,2);
    auVar2 = vpinsrw_avx(auVar2,0x10,3);
    auVar2 = vpinsrw_avx(auVar2,0x10,4);
    auVar2 = vpinsrw_avx(auVar2,0x10,5);
    auVar2 = vpinsrw_avx(auVar2,0x10,6);
    auStack_1170 = vpinsrw_avx(auVar2,0x10,7);
    local_1180 = auVar1;
    local_1180._0_8_ = auVar1._0_8_;
    local_1180._8_8_ = auVar1._8_8_;
    local_13c0 = local_1180._0_8_;
    uStack_13b8 = local_1180._8_8_;
    uStack_13b0 = auStack_1170._0_8_;
    uStack_13a8 = auStack_1170._8_8_;
    local_1264 = *(ushort *)(in_RCX + (long)(int)uVar36 * 2);
    local_1102 = local_1264;
    local_1104 = local_1264;
    local_1106 = local_1264;
    local_1108 = local_1264;
    local_110a = local_1264;
    local_110c = local_1264;
    local_110e = local_1264;
    local_1110 = local_1264;
    local_1112 = local_1264;
    local_1114 = local_1264;
    local_1116 = local_1264;
    local_1118 = local_1264;
    local_111a = local_1264;
    local_111c = local_1264;
    local_111e = local_1264;
    local_1120 = local_1264;
    auVar2 = vpinsrw_avx(ZEXT216(local_1264),(uint)local_1264,1);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_1264,2);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_1264,3);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_1264,4);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_1264,5);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_1264,6);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_1264,7);
    auVar3 = vpinsrw_avx(ZEXT216(local_1264),(uint)local_1264,1);
    auVar3 = vpinsrw_avx(auVar3,(uint)local_1264,2);
    auVar3 = vpinsrw_avx(auVar3,(uint)local_1264,3);
    auVar3 = vpinsrw_avx(auVar3,(uint)local_1264,4);
    auVar3 = vpinsrw_avx(auVar3,(uint)local_1264,5);
    auVar3 = vpinsrw_avx(auVar3,(uint)local_1264,6);
    auStack_1130 = vpinsrw_avx(auVar3,(uint)local_1264,7);
    local_1140 = auVar2;
    local_1140._0_8_ = auVar2._0_8_;
    local_1140._8_8_ = auVar2._8_8_;
    local_1400 = local_1140._0_8_;
    uStack_13f8 = local_1140._8_8_;
    uStack_13f0 = auStack_1130._0_8_;
    uStack_13e8 = auStack_1130._8_8_;
    local_1328._0_2_ = (ushort)uVar36;
    local_1266 = (ushort)local_1328;
    local_10c2 = (ushort)local_1328;
    local_10c4 = (ushort)local_1328;
    local_10c6 = (ushort)local_1328;
    local_10c8 = (ushort)local_1328;
    local_10ca = (ushort)local_1328;
    local_10cc = (ushort)local_1328;
    local_10ce = (ushort)local_1328;
    local_10d0 = (ushort)local_1328;
    local_10d2 = (ushort)local_1328;
    local_10d4 = (ushort)local_1328;
    local_10d6 = (ushort)local_1328;
    local_10d8 = (ushort)local_1328;
    local_10da = (ushort)local_1328;
    local_10dc = (ushort)local_1328;
    local_10de = (ushort)local_1328;
    local_10e0 = (ushort)local_1328;
    auVar3 = vpinsrw_avx(ZEXT216((ushort)local_1328),uVar36 & 0xffff,1);
    auVar3 = vpinsrw_avx(auVar3,uVar36 & 0xffff,2);
    auVar3 = vpinsrw_avx(auVar3,uVar36 & 0xffff,3);
    auVar3 = vpinsrw_avx(auVar3,uVar36 & 0xffff,4);
    auVar3 = vpinsrw_avx(auVar3,uVar36 & 0xffff,5);
    auVar3 = vpinsrw_avx(auVar3,uVar36 & 0xffff,6);
    auVar3 = vpinsrw_avx(auVar3,uVar36 & 0xffff,7);
    auVar4 = vpinsrw_avx(ZEXT216((ushort)local_1328),uVar36 & 0xffff,1);
    auVar4 = vpinsrw_avx(auVar4,uVar36 & 0xffff,2);
    auVar4 = vpinsrw_avx(auVar4,uVar36 & 0xffff,3);
    auVar4 = vpinsrw_avx(auVar4,uVar36 & 0xffff,4);
    auVar4 = vpinsrw_avx(auVar4,uVar36 & 0xffff,5);
    auVar4 = vpinsrw_avx(auVar4,uVar36 & 0xffff,6);
    auStack_10f0 = vpinsrw_avx(auVar4,uVar36 & 0xffff,7);
    local_1100 = auVar3;
    local_1100._0_8_ = auVar3._0_8_;
    local_1100._8_8_ = auVar3._8_8_;
    local_1440 = local_1100._0_8_;
    uStack_1438 = local_1100._8_8_;
    uStack_1430 = auStack_10f0._0_8_;
    uStack_1428 = auStack_10f0._8_8_;
    local_1268 = 0x3f;
    local_1082 = 0x3f;
    local_1084 = 0x3f;
    local_1086 = 0x3f;
    local_1088 = 0x3f;
    local_108a = 0x3f;
    local_108c = 0x3f;
    local_108e = 0x3f;
    local_1090 = 0x3f;
    local_1092 = 0x3f;
    local_1094 = 0x3f;
    local_1096 = 0x3f;
    local_1098 = 0x3f;
    local_109a = 0x3f;
    local_109c = 0x3f;
    local_109e = 0x3f;
    local_10a0 = 0x3f;
    auVar4 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar4 = vpinsrw_avx(auVar4,0x3f,2);
    auVar4 = vpinsrw_avx(auVar4,0x3f,3);
    auVar4 = vpinsrw_avx(auVar4,0x3f,4);
    auVar4 = vpinsrw_avx(auVar4,0x3f,5);
    auVar4 = vpinsrw_avx(auVar4,0x3f,6);
    auVar4 = vpinsrw_avx(auVar4,0x3f,7);
    auVar5 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar5 = vpinsrw_avx(auVar5,0x3f,2);
    auVar5 = vpinsrw_avx(auVar5,0x3f,3);
    auVar5 = vpinsrw_avx(auVar5,0x3f,4);
    auVar5 = vpinsrw_avx(auVar5,0x3f,5);
    auVar5 = vpinsrw_avx(auVar5,0x3f,6);
    auVar5 = vpinsrw_avx(auVar5,0x3f,7);
    auVar39._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar5;
    auVar39._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
    local_10c0 = auVar39;
    local_10c0._16_8_ = auVar39._16_8_;
    local_10c0._24_8_ = auVar39._24_8_;
    local_13e0 = auVar39._0_16_;
    auStack_13d0 = auVar39._16_16_;
    local_14a4 = in_R9D;
    for (local_14a8 = 0; local_14a8 < in_EDI; local_14a8 = local_14a8 + 1) {
      local_1544 = (int)local_14a4 >> ((byte)(6 - in_R8D) & 0x1f);
      if ((int)uVar36 <= local_1544) {
        for (local_1548 = local_14a8; local_1548 < in_EDI; local_1548 = local_1548 + 1) {
          local_1240 = local_1140._0_8_;
          uStack_1238 = local_1140._8_8_;
          uStack_1230 = auStack_1130._0_8_;
          uStack_1228 = auStack_1130._8_8_;
          local_17d0[(long)local_1548 * 2] = local_1140._0_8_;
          local_17d0[(long)local_1548 * 2 + 1] = local_1140._8_8_;
        }
        break;
      }
      local_ef0 = (undefined1 (*) [16])(in_RCX + (long)local_1544 * 2);
      local_1490 = *local_ef0;
      uVar9 = (ushort)local_1544;
      if (in_R8D == 0) {
        local_f00 = (undefined1 (*) [16])(in_RCX + 2 + (long)local_1544 * 2);
        local_14a0 = *local_f00;
        auVar4 = vpinsrw_avx(ZEXT216(uVar9),(uint)(ushort)(uVar9 + 1),1);
        auVar4 = vpinsrw_avx(auVar4,(uint)(ushort)(uVar9 + 2),2);
        auVar4 = vpinsrw_avx(auVar4,(uint)(ushort)(uVar9 + 3),3);
        auVar4 = vpinsrw_avx(auVar4,(uint)(ushort)(uVar9 + 4),4);
        auVar4 = vpinsrw_avx(auVar4,(uint)(ushort)(uVar9 + 5),5);
        auVar4 = vpinsrw_avx(auVar4,(uint)(ushort)(uVar9 + 6),6);
        auVar4 = vpinsrw_avx(auVar4,(uint)(ushort)(uVar9 + 7),7);
        auVar5 = vpinsrw_avx(ZEXT216(0),0,1);
        auVar5 = vpinsrw_avx(auVar5,0,2);
        auVar5 = vpinsrw_avx(auVar5,0,3);
        auVar5 = vpinsrw_avx(auVar5,0,4);
        auVar5 = vpinsrw_avx(auVar5,0,5);
        auVar5 = vpinsrw_avx(auVar5,0,6);
        auVar5 = vpinsrw_avx(auVar5,0,7);
        local_320 = auVar4._0_8_;
        uStack_318 = auVar4._8_8_;
        uStack_310 = auVar5._0_8_;
        uStack_308 = auVar5._8_8_;
        local_1460 = local_320;
        uStack_1458 = uStack_318;
        uStack_1450 = uStack_310;
        uStack_1448 = uStack_308;
        local_126c = (ushort)local_14a4;
        local_1002 = (ushort)local_14a4;
        local_1004 = (ushort)local_14a4;
        local_1006 = (ushort)local_14a4;
        local_1008 = (ushort)local_14a4;
        local_100a = (ushort)local_14a4;
        local_100c = (ushort)local_14a4;
        local_100e = (ushort)local_14a4;
        local_1010 = (ushort)local_14a4;
        local_1012 = (ushort)local_14a4;
        local_1014 = (ushort)local_14a4;
        local_1016 = (ushort)local_14a4;
        local_1018 = (ushort)local_14a4;
        local_101a = (ushort)local_14a4;
        local_101c = (ushort)local_14a4;
        local_101e = (ushort)local_14a4;
        local_1020 = (ushort)local_14a4;
        auVar4 = vpinsrw_avx(ZEXT216((ushort)local_14a4),local_14a4 & 0xffff,1);
        auVar4 = vpinsrw_avx(auVar4,local_14a4 & 0xffff,2);
        auVar4 = vpinsrw_avx(auVar4,local_14a4 & 0xffff,3);
        auVar4 = vpinsrw_avx(auVar4,local_14a4 & 0xffff,4);
        auVar4 = vpinsrw_avx(auVar4,local_14a4 & 0xffff,5);
        auVar4 = vpinsrw_avx(auVar4,local_14a4 & 0xffff,6);
        auVar4 = vpinsrw_avx(auVar4,local_14a4 & 0xffff,7);
        auVar5 = vpinsrw_avx(ZEXT216((ushort)local_14a4),local_14a4 & 0xffff,1);
        auVar5 = vpinsrw_avx(auVar5,local_14a4 & 0xffff,2);
        auVar5 = vpinsrw_avx(auVar5,local_14a4 & 0xffff,3);
        auVar5 = vpinsrw_avx(auVar5,local_14a4 & 0xffff,4);
        auVar5 = vpinsrw_avx(auVar5,local_14a4 & 0xffff,5);
        auVar5 = vpinsrw_avx(auVar5,local_14a4 & 0xffff,6);
        auVar5 = vpinsrw_avx(auVar5,local_14a4 & 0xffff,7);
        local_1040._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar5;
        local_1040._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
        local_f60 = local_1040._0_16_;
        auStack_f50 = local_1040._16_16_;
        local_f80 = auVar39._0_16_;
        auStack_f70 = auVar39._16_16_;
        auVar19._16_8_ = local_1040._16_8_;
        auVar19._0_16_ = local_1040._0_16_;
        auVar19._24_8_ = local_1040._24_8_;
        auVar18._16_8_ = local_10c0._16_8_;
        auVar18._0_16_ = auVar39._0_16_;
        auVar18._24_8_ = local_10c0._24_8_;
        local_ea0 = vpand_avx2(auVar19,auVar18);
        local_ea4 = 1;
        local_1540 = vpsrlw_avx2(local_ea0,ZEXT416(1));
      }
      else {
        local_ef8 = (undefined1 (*) [16])(in_RCX + 0x10 + (long)local_1544 * 2);
        local_1190 = *(undefined8 *)*local_ef0;
        uStack_1188 = *(undefined8 *)(*local_ef0 + 8);
        local_11a0 = (uint8_t  [8])HighbdEvenOddMaskx[0]._0_8_;
        auStack_1198 = (uint8_t  [8])HighbdEvenOddMaskx[0]._8_8_;
        auVar13._8_8_ = HighbdEvenOddMaskx[0]._8_8_;
        auVar13._0_8_ = HighbdEvenOddMaskx[0]._0_8_;
        local_1570 = vpshufb_avx(*local_ef0,auVar13);
        local_11b0 = *(undefined8 *)*local_ef8;
        uStack_11a8 = *(undefined8 *)(*local_ef8 + 8);
        local_11c0 = (uint8_t  [8])HighbdEvenOddMaskx[0]._0_8_;
        auStack_11b8 = (uint8_t  [8])HighbdEvenOddMaskx[0]._8_8_;
        auVar12._8_8_ = HighbdEvenOddMaskx[0]._8_8_;
        auVar12._0_8_ = HighbdEvenOddMaskx[0]._0_8_;
        local_1580 = vpshufb_avx(*local_ef8,auVar12);
        local_11d0 = *(undefined8 *)*local_ef0;
        uStack_11c8 = *(undefined8 *)(*local_ef0 + 8);
        local_11e0 = (uint8_t  [8])HighbdEvenOddMaskx[0]._16_8_;
        auStack_11d8 = (uint8_t  [8])HighbdEvenOddMaskx[0]._24_8_;
        auVar5._8_8_ = HighbdEvenOddMaskx[0]._24_8_;
        auVar5._0_8_ = HighbdEvenOddMaskx[0]._16_8_;
        local_1590 = vpshufb_avx(*local_ef0,auVar5);
        local_11f0 = *(undefined8 *)*local_ef8;
        uStack_11e8 = *(undefined8 *)(*local_ef8 + 8);
        local_1200 = (uint8_t  [8])HighbdEvenOddMaskx[0]._16_8_;
        auStack_11f8 = (uint8_t  [8])HighbdEvenOddMaskx[0]._24_8_;
        auVar4._8_8_ = HighbdEvenOddMaskx[0]._24_8_;
        auVar4._0_8_ = HighbdEvenOddMaskx[0]._16_8_;
        local_15a0 = vpshufb_avx(*local_ef8,auVar4);
        auVar4 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
        auVar4 = vpinsrb_avx(auVar4,0xf,2);
        auVar4 = vpinsrb_avx(auVar4,0xf,3);
        auVar4 = vpinsrb_avx(auVar4,0xf,4);
        auVar4 = vpinsrb_avx(auVar4,0xf,5);
        auVar4 = vpinsrb_avx(auVar4,0xf,6);
        auVar4 = vpinsrb_avx(auVar4,0xf,7);
        auVar4 = vpinsrb_avx(auVar4,0xf,8);
        auVar4 = vpinsrb_avx(auVar4,0xf,9);
        auVar4 = vpinsrb_avx(auVar4,0xf,10);
        auVar4 = vpinsrb_avx(auVar4,0xf,0xb);
        auVar4 = vpinsrb_avx(auVar4,0xf,0xc);
        auVar4 = vpinsrb_avx(auVar4,0xf,0xd);
        auVar4 = vpinsrb_avx(auVar4,0xf,0xe);
        auVar4 = vpinsrb_avx(auVar4,0xf,0xf);
        auVar28._8_8_ = HighbdEvenOddMaskx[0]._8_8_;
        auVar28._0_8_ = HighbdEvenOddMaskx[0]._0_8_;
        auVar4 = vpcmpgtb_avx(auVar28,auVar4);
        local_1560._0_8_ = auVar4._0_8_;
        local_1560._8_8_ = auVar4._8_8_;
        local_d20 = local_1570._0_8_;
        uStack_d18 = local_1570._8_8_;
        local_d30 = local_1580._0_8_;
        uStack_d28 = local_1580._8_8_;
        local_d40 = local_1560._0_8_;
        uStack_d38 = local_1560._8_8_;
        local_1490 = vpblendvb_avx(local_1570,local_1580,auVar4);
        auVar4 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
        auVar4 = vpinsrb_avx(auVar4,0xf,2);
        auVar4 = vpinsrb_avx(auVar4,0xf,3);
        auVar4 = vpinsrb_avx(auVar4,0xf,4);
        auVar4 = vpinsrb_avx(auVar4,0xf,5);
        auVar4 = vpinsrb_avx(auVar4,0xf,6);
        auVar4 = vpinsrb_avx(auVar4,0xf,7);
        auVar4 = vpinsrb_avx(auVar4,0xf,8);
        auVar4 = vpinsrb_avx(auVar4,0xf,9);
        auVar4 = vpinsrb_avx(auVar4,0xf,10);
        auVar4 = vpinsrb_avx(auVar4,0xf,0xb);
        auVar4 = vpinsrb_avx(auVar4,0xf,0xc);
        auVar4 = vpinsrb_avx(auVar4,0xf,0xd);
        auVar4 = vpinsrb_avx(auVar4,0xf,0xe);
        auVar4 = vpinsrb_avx(auVar4,0xf,0xf);
        auVar27._8_8_ = HighbdEvenOddMaskx[0]._24_8_;
        auVar27._0_8_ = HighbdEvenOddMaskx[0]._16_8_;
        local_1560 = vpcmpgtb_avx(auVar27,auVar4);
        local_d50 = local_1590._0_8_;
        uStack_d48 = local_1590._8_8_;
        local_d60 = local_15a0._0_8_;
        uStack_d58 = local_15a0._8_8_;
        local_d70 = local_1560._0_8_;
        uStack_d68 = local_1560._8_8_;
        local_14a0 = vpblendvb_avx(local_1590,local_15a0,local_1560);
        auVar4 = vpinsrw_avx(ZEXT216(uVar9),(uint)(ushort)(uVar9 + 2),1);
        auVar4 = vpinsrw_avx(auVar4,(uint)(ushort)(uVar9 + 4),2);
        auVar4 = vpinsrw_avx(auVar4,(uint)(ushort)(uVar9 + 6),3);
        auVar4 = vpinsrw_avx(auVar4,(uint)(ushort)(uVar9 + 8),4);
        auVar4 = vpinsrw_avx(auVar4,(uint)(ushort)(uVar9 + 10),5);
        auVar4 = vpinsrw_avx(auVar4,(uint)(ushort)(uVar9 + 0xc),6);
        auVar4 = vpinsrw_avx(auVar4,(uint)(ushort)(uVar9 + 0xe),7);
        auVar5 = vpinsrw_avx(ZEXT216(0),0,1);
        auVar5 = vpinsrw_avx(auVar5,0,2);
        auVar5 = vpinsrw_avx(auVar5,0,3);
        auVar5 = vpinsrw_avx(auVar5,0,4);
        auVar5 = vpinsrw_avx(auVar5,0,5);
        auVar5 = vpinsrw_avx(auVar5,0,6);
        auVar5 = vpinsrw_avx(auVar5,0,7);
        local_380 = auVar4._0_8_;
        uStack_378 = auVar4._8_8_;
        uStack_370 = auVar5._0_8_;
        uStack_368 = auVar5._8_8_;
        local_1460 = local_380;
        uStack_1458 = uStack_378;
        uStack_1450 = uStack_370;
        uStack_1448 = uStack_368;
        local_126a = (ushort)local_14a4;
        local_1042 = (ushort)local_14a4;
        local_1044 = (ushort)local_14a4;
        local_1046 = (ushort)local_14a4;
        local_1048 = (ushort)local_14a4;
        local_104a = (ushort)local_14a4;
        local_104c = (ushort)local_14a4;
        local_104e = (ushort)local_14a4;
        local_1050 = (ushort)local_14a4;
        local_1052 = (ushort)local_14a4;
        local_1054 = (ushort)local_14a4;
        local_1056 = (ushort)local_14a4;
        local_1058 = (ushort)local_14a4;
        local_105a = (ushort)local_14a4;
        local_105c = (ushort)local_14a4;
        local_105e = (ushort)local_14a4;
        local_1060 = (ushort)local_14a4;
        auVar4 = vpinsrw_avx(ZEXT216((ushort)local_14a4),local_14a4 & 0xffff,1);
        auVar4 = vpinsrw_avx(auVar4,local_14a4 & 0xffff,2);
        auVar4 = vpinsrw_avx(auVar4,local_14a4 & 0xffff,3);
        auVar4 = vpinsrw_avx(auVar4,local_14a4 & 0xffff,4);
        auVar4 = vpinsrw_avx(auVar4,local_14a4 & 0xffff,5);
        auVar4 = vpinsrw_avx(auVar4,local_14a4 & 0xffff,6);
        auVar4 = vpinsrw_avx(auVar4,local_14a4 & 0xffff,7);
        auVar5 = vpinsrw_avx(ZEXT216((ushort)local_14a4),local_14a4 & 0xffff,1);
        auVar5 = vpinsrw_avx(auVar5,local_14a4 & 0xffff,2);
        auVar5 = vpinsrw_avx(auVar5,local_14a4 & 0xffff,3);
        auVar5 = vpinsrw_avx(auVar5,local_14a4 & 0xffff,4);
        auVar5 = vpinsrw_avx(auVar5,local_14a4 & 0xffff,5);
        auVar5 = vpinsrw_avx(auVar5,local_14a4 & 0xffff,6);
        auVar5 = vpinsrw_avx(auVar5,local_14a4 & 0xffff,7);
        local_1080._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar5;
        local_1080._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
        local_de0 = local_1080._0_16_;
        auStack_dd0 = local_1080._16_16_;
        auVar22._16_8_ = local_1080._16_8_;
        auVar22._0_16_ = local_1080._0_16_;
        auVar22._24_8_ = local_1080._24_8_;
        local_f20 = vpsllw_avx2(auVar22,ZEXT416(in_R8D));
        local_f40 = auVar39._0_16_;
        auStack_f30 = auVar39._16_16_;
        auVar20._16_8_ = local_10c0._16_8_;
        auVar20._0_16_ = auVar39._0_16_;
        auVar20._24_8_ = local_10c0._24_8_;
        local_e60 = vpand_avx2(local_f20,auVar20);
        local_e64 = 1;
        local_1540 = vpsrlw_avx2(local_e60,ZEXT416(1));
      }
      local_1210 = local_1490._0_8_;
      uStack_1208 = local_1490._8_8_;
      auStack_1350 = ZEXT416(1);
      local_1360 = local_1490._0_8_;
      uStack_1358 = local_1490._8_8_;
      local_1220 = local_14a0._0_8_;
      uStack_1218 = local_14a0._8_8_;
      auStack_1370 = auStack_1350;
      local_1380 = local_14a0._0_8_;
      uStack_1378 = local_14a0._8_8_;
      auStack_1370._0_8_ = auStack_1350._0_8_;
      local_fe0 = local_14a0._0_8_;
      uStack_fd8 = local_14a0._8_8_;
      uStack_fd0 = auStack_1370._0_8_;
      uStack_fc8 = 0;
      local_1000 = local_1490._0_8_;
      uStack_ff8 = local_1490._8_8_;
      uStack_ff0 = auStack_1370._0_8_;
      uStack_fe8 = 0;
      auVar15._16_8_ = auStack_1370._0_8_;
      auVar15._0_16_ = local_14a0;
      auVar15._24_8_ = 0;
      auVar14._16_8_ = auStack_1370._0_8_;
      auVar14._0_16_ = local_1490;
      auVar14._24_8_ = 0;
      local_1420 = vpsubw_avx2(auVar15,auVar14);
      local_e20 = local_1490._0_8_;
      uStack_e18 = local_1490._8_8_;
      uStack_e10 = auStack_1370._0_8_;
      uStack_e08 = 0;
      local_e24 = 5;
      auVar21._16_8_ = auStack_1370._0_8_;
      auVar21._0_16_ = local_1490;
      auVar21._24_8_ = 0;
      auVar40 = vpsllw_avx2(auVar21,ZEXT416(5));
      local_13a0._0_8_ = auVar40._0_8_;
      local_13a0._8_8_ = auVar40._8_8_;
      local_13a0._16_8_ = auVar40._16_8_;
      local_13a0._24_8_ = auVar40._24_8_;
      local_12a0 = local_13a0._0_8_;
      uStack_1298 = local_13a0._8_8_;
      uStack_1290 = local_13a0._16_8_;
      uStack_1288 = local_13a0._24_8_;
      local_12c0 = local_1180._0_8_;
      uStack_12b8 = local_1180._8_8_;
      uStack_12b0 = auStack_1170._0_8_;
      uStack_12a8 = auStack_1170._8_8_;
      auVar11._16_8_ = auStack_1170._0_8_;
      auVar11._0_16_ = auVar1;
      auVar11._24_8_ = auStack_1170._8_8_;
      local_13a0 = vpaddw_avx2(auVar40,auVar11);
      local_da0 = local_1420._0_8_;
      uStack_d98 = local_1420._8_8_;
      uStack_d90 = local_1420._16_8_;
      uStack_d88 = local_1420._24_8_;
      local_dc0 = local_1540._0_8_;
      uStack_db8 = local_1540._8_8_;
      uStack_db0 = local_1540._16_8_;
      uStack_da8 = local_1540._24_8_;
      local_14e0 = vpmullw_avx2(local_1420,local_1540);
      local_12e0 = local_13a0._0_8_;
      uStack_12d8 = local_13a0._8_8_;
      uStack_12d0 = local_13a0._16_8_;
      uStack_12c8 = local_13a0._24_8_;
      local_1300 = local_14e0._0_8_;
      uStack_12f8 = local_14e0._8_8_;
      uStack_12f0 = local_14e0._16_8_;
      uStack_12e8 = local_14e0._24_8_;
      auVar40 = vpaddw_avx2(local_13a0,local_14e0);
      local_1500._0_8_ = auVar40._0_8_;
      local_1500._8_8_ = auVar40._8_8_;
      local_1500._16_8_ = auVar40._16_8_;
      local_1500._24_8_ = auVar40._24_8_;
      local_ee0 = local_1500._0_8_;
      uStack_ed8 = local_1500._8_8_;
      uStack_ed0 = local_1500._16_8_;
      uStack_ec8 = local_1500._24_8_;
      local_ee4 = 5;
      local_1500 = vpsrlw_avx2(auVar40,ZEXT416(5));
      local_fa0 = local_1100._0_8_;
      uStack_f98 = local_1100._8_8_;
      uStack_f90 = auStack_10f0._0_8_;
      uStack_f88 = auStack_10f0._8_8_;
      local_fc0 = local_1460;
      uStack_fb8 = uStack_1458;
      uStack_fb0 = uStack_1450;
      uStack_fa8 = uStack_1448;
      auVar17._16_8_ = auStack_10f0._0_8_;
      auVar17._0_16_ = auVar3;
      auVar17._24_8_ = auStack_10f0._8_8_;
      auVar16._8_8_ = uStack_1458;
      auVar16._0_8_ = local_1460;
      auVar16._16_8_ = uStack_1450;
      auVar16._24_8_ = uStack_1448;
      local_1480 = vpcmpgtw_avx2(auVar17,auVar16);
      auVar30._16_8_ = auStack_1130._0_8_;
      auVar30._0_16_ = auVar2;
      auVar30._24_8_ = auStack_1130._8_8_;
      local_1520 = vpblendvb_avx2(auVar30,local_1500,local_1480);
      local_1260 = local_1520._0_8_;
      uStack_1258 = local_1520._8_8_;
      uStack_1250 = local_1520._16_8_;
      uStack_1248 = local_1520._24_8_;
      local_17d0[(long)local_14a8 * 2] = local_1520._0_8_;
      local_17d0[(long)local_14a8 * 2 + 1] = local_1520._8_8_;
      local_14a4 = in_R9D + local_14a4;
    }
  }
  else {
    local_ad0 = local_17d0;
    local_ae4 = 6 - in_R8D;
    uVar36 = in_EDI + 7 << (local_131c & 0x1f);
    local_ae8 = uVar36;
    local_914 = 0x10;
    local_824 = 0x10;
    local_828 = 0x10;
    local_82c = 0x10;
    local_830 = 0x10;
    local_834 = 0x10;
    local_838 = 0x10;
    local_83c = 0x10;
    local_840 = 0x10;
    auVar1 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
    auVar1 = vpinsrd_avx(auVar1,0x10,2);
    auVar1 = vpinsrd_avx(auVar1,0x10,3);
    auVar2 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
    auVar2 = vpinsrd_avx(auVar2,0x10,2);
    auStack_850 = vpinsrd_avx(auVar2,0x10,3);
    local_860 = auVar1;
    local_860._0_8_ = auVar1._0_8_;
    local_860._8_8_ = auVar1._8_8_;
    local_bc0 = local_860._0_8_;
    uStack_bb8 = local_860._8_8_;
    uStack_bb0 = auStack_850._0_8_;
    uStack_ba8 = auStack_850._8_8_;
    local_ac2 = *(ushort *)(in_RCX + (long)(int)uVar36 * 2);
    local_9c2 = local_ac2;
    local_9c4 = local_ac2;
    local_9c6 = local_ac2;
    local_9c8 = local_ac2;
    local_9ca = local_ac2;
    local_9cc = local_ac2;
    local_9ce = local_ac2;
    local_9d0 = local_ac2;
    local_9d2 = local_ac2;
    local_9d4 = local_ac2;
    local_9d6 = local_ac2;
    local_9d8 = local_ac2;
    local_9da = local_ac2;
    local_9dc = local_ac2;
    local_9de = local_ac2;
    local_9e0 = local_ac2;
    auVar2 = vpinsrw_avx(ZEXT216(local_ac2),(uint)local_ac2,1);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_ac2,2);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_ac2,3);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_ac2,4);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_ac2,5);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_ac2,6);
    auVar4 = vpinsrw_avx(auVar2,(uint)local_ac2,7);
    auVar2 = vpinsrw_avx(ZEXT216(local_ac2),(uint)local_ac2,1);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_ac2,2);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_ac2,3);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_ac2,4);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_ac2,5);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_ac2,6);
    auStack_9f0 = vpinsrw_avx(auVar2,(uint)local_ac2,7);
    local_a00 = auVar4;
    local_a00._0_8_ = auVar4._0_8_;
    uVar10 = local_a00._0_8_;
    local_a00._8_8_ = auVar4._8_8_;
    uVar35 = local_a00._8_8_;
    local_be0 = local_a00._0_8_;
    uStack_bd8 = local_a00._8_8_;
    uStack_bd0 = auStack_9f0._0_8_;
    uStack_bc8 = auStack_9f0._8_8_;
    local_918 = uVar36;
    local_7e4 = uVar36;
    local_7e8 = uVar36;
    local_7ec = uVar36;
    local_7f0 = uVar36;
    local_7f4 = uVar36;
    local_7f8 = uVar36;
    local_7fc = uVar36;
    local_800 = uVar36;
    auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
    auVar2 = vpinsrd_avx(auVar2,uVar36,2);
    auVar2 = vpinsrd_avx(auVar2,uVar36,3);
    auVar3 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
    auVar3 = vpinsrd_avx(auVar3,uVar36,2);
    auVar3 = vpinsrd_avx(auVar3,uVar36,3);
    auVar40._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
    auVar40._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
    local_820 = auVar40;
    local_820._16_8_ = auVar40._16_8_;
    local_820._24_8_ = auVar40._24_8_;
    local_c20 = auVar40._0_16_;
    auStack_c10 = auVar40._16_16_;
    local_c64 = in_R9D;
    for (local_c68 = 0; local_c68 < in_EDI; local_c68 = local_c68 + 1) {
      local_d04 = (int)local_c64 >> ((byte)(6 - in_R8D) & 0x1f);
      if ((int)uVar36 <= (int)local_d04) {
        for (local_d08 = local_c68; local_d08 < in_EDI; local_d08 = local_d08 + 1) {
          local_a60 = uVar10;
          uStack_a58 = uVar35;
          uStack_a50 = auStack_9f0._0_8_;
          uStack_a48 = auStack_9f0._8_8_;
          local_17d0[(long)local_d08 * 2] = uVar10;
          local_17d0[(long)local_d08 * 2 + 1] = uVar35;
        }
        break;
      }
      local_930 = (undefined1 (*) [16])(in_RCX + (long)(int)local_d04 * 2);
      local_8f0 = *(undefined8 *)*local_930;
      uStack_8e8 = *(undefined8 *)(*local_930 + 8);
      auVar6 = vpmovzxwd_avx2(*local_930);
      _local_b20 = auVar6;
      lVar37 = in_RCX + (long)(int)local_d04 * 2;
      local_938 = (undefined1 (*) [16])(lVar37 + 2);
      local_900 = *(undefined8 *)*local_938;
      uStack_8f8 = *(undefined8 *)(lVar37 + 10);
      local_b40 = vpmovzxwd_avx2(*local_938);
      if (in_R8D == 0) {
        auVar2 = vpinsrd_avx(ZEXT416(local_d04),local_d04 + 1,1);
        auVar2 = vpinsrd_avx(auVar2,local_d04 + 2,2);
        auVar2 = vpinsrd_avx(auVar2,local_d04 + 3,3);
        auVar3 = vpinsrd_avx(ZEXT416(local_d04 + 4),local_d04 + 5,1);
        auVar3 = vpinsrd_avx(auVar3,local_d04 + 6,2);
        auVar3 = vpinsrd_avx(auVar3,local_d04 + 7,3);
        local_160 = auVar2._0_8_;
        uStack_158 = auVar2._8_8_;
        uStack_150 = auVar3._0_8_;
        uStack_148 = auVar3._8_8_;
        local_c40 = local_160;
        uStack_c38 = uStack_158;
        uStack_c30 = uStack_150;
        uStack_c28 = uStack_148;
        local_924 = local_c64;
        auVar2 = vpinsrd_avx(ZEXT416(local_c64),local_c64,1);
        auVar2 = vpinsrd_avx(auVar2,local_c64,2);
        auVar2 = vpinsrd_avx(auVar2,local_c64,3);
        auVar3 = vpinsrd_avx(ZEXT416(local_c64),local_c64,1);
        auVar3 = vpinsrd_avx(auVar3,local_c64,2);
        auVar3 = vpinsrd_avx(auVar3,local_c64,3);
        local_760 = auVar2._0_8_;
        uStack_758 = auVar2._8_8_;
        uStack_750 = auVar3._0_8_;
        uStack_748 = auVar3._8_8_;
        local_928 = 0x3f;
        auVar3 = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar3 = vpinsrd_avx(auVar3,0x3f,2);
        auVar3 = vpinsrd_avx(auVar3,0x3f,3);
        auVar5 = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar5 = vpinsrd_avx(auVar5,0x3f,2);
        auVar5 = vpinsrd_avx(auVar5,0x3f,3);
        local_9c0 = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar5;
        auStack_9b0 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar3;
        uStack_710 = auStack_9b0._0_8_;
        uStack_708 = auStack_9b0._8_8_;
        local_9a0 = local_760;
        uStack_998 = uStack_758;
        uStack_990 = uStack_750;
        uStack_988 = uStack_748;
        auVar7._16_8_ = uStack_750;
        auVar7._0_16_ = auVar2;
        auVar7._24_8_ = uStack_748;
        auVar6._16_8_ = uStack_710;
        auVar6._0_16_ = local_9c0;
        auVar6._24_8_ = uStack_708;
        auVar6 = vpand_avx2(auVar7,auVar6);
        local_d00 = vpsrld_avx2(auVar6,ZEXT416(1));
      }
      else {
        local_b20._0_8_ = auVar6._0_8_;
        uStack_a90 = local_b20._0_8_;
        local_b20._8_8_ = auVar6._8_8_;
        uStack_a88 = local_b20._8_8_;
        local_b20._16_8_ = auVar6._16_8_;
        uStack_b08 = auVar6._24_8_;
        auVar2 = vpinsrd_avx(ZEXT416(0),2,1);
        auVar2 = vpinsrd_avx(auVar2,4,2);
        auVar2 = vpinsrd_avx(auVar2,6,3);
        auVar3 = vpinsrd_avx(ZEXT416(1),3,1);
        auVar3 = vpinsrd_avx(auVar3,5,2);
        auVar3 = vpinsrd_avx(auVar3,7,3);
        local_6a0 = auVar2._0_8_;
        uStack_698 = auVar2._8_8_;
        uStack_690 = auVar3._0_8_;
        uStack_688 = auVar3._8_8_;
        local_880 = local_b20._0_8_;
        uStack_878 = local_b20._8_8_;
        uStack_870 = local_b20._16_8_;
        uStack_868 = uStack_b08;
        local_8a0 = local_6a0;
        uStack_898 = uStack_698;
        uStack_890 = uStack_690;
        uStack_888 = uStack_688;
        auVar24._16_8_ = uStack_690;
        auVar24._0_16_ = auVar2;
        auVar24._24_8_ = uStack_688;
        auVar8 = vpermd_avx2(auVar24,auVar6);
        stack0xfffffffffffff4f0 = auVar8._16_16_;
        local_a00 = stack0xfffffffffffff4f0;
        local_b40._8_8_ = uStack_a08;
        local_b40._0_8_ = local_a10;
        local_940 = (undefined1 (*) [16])(in_RCX + 0x10 + (long)(int)local_d04 * 2);
        local_910 = *(undefined8 *)*local_940;
        uStack_908 = *(undefined8 *)(*local_940 + 8);
        auVar7 = vpmovzxwd_avx2(*local_940);
        local_b60._0_8_ = auVar7._0_8_;
        local_b60._8_8_ = auVar7._8_8_;
        local_b60._16_8_ = auVar7._16_8_;
        local_b60._24_8_ = auVar7._24_8_;
        auVar2 = vpinsrd_avx(ZEXT416(0),2,1);
        auVar2 = vpinsrd_avx(auVar2,4,2);
        auVar2 = vpinsrd_avx(auVar2,6,3);
        auVar3 = vpinsrd_avx(ZEXT416(1),3,1);
        auVar3 = vpinsrd_avx(auVar3,5,2);
        auVar3 = vpinsrd_avx(auVar3,7,3);
        local_6e0 = auVar2._0_8_;
        uStack_6d8 = auVar2._8_8_;
        uStack_6d0 = auVar3._0_8_;
        uStack_6c8 = auVar3._8_8_;
        local_8c0 = local_b60._0_8_;
        uStack_8b8 = local_b60._8_8_;
        uStack_8b0 = local_b60._16_8_;
        uStack_8a8 = local_b60._24_8_;
        local_8e0 = local_6e0;
        uStack_8d8 = uStack_6d8;
        uStack_8d0 = uStack_6d0;
        uStack_8c8 = uStack_6c8;
        auVar23._16_8_ = uStack_6d0;
        auVar23._0_16_ = auVar2;
        auVar23._24_8_ = uStack_6c8;
        local_b60 = vpermd_avx2(auVar23,auVar7);
        local_a10 = local_b60._16_8_;
        uStack_a08 = local_b60._24_8_;
        auStack_b70 = auVar6._0_16_;
        local_a80 = local_b60._0_8_;
        uStack_a78 = local_b60._8_8_;
        uStack_a70 = local_b60._16_8_;
        uStack_a68 = local_b60._24_8_;
        local_b20._0_16_ = ZEXT116(0) * local_b60._0_16_ + ZEXT116(1) * auVar8._0_16_;
        register0x00001210 = ZEXT116(0) * stack0xfffffffffffff4f0 + ZEXT116(1) * local_b60._0_16_;
        auVar2._8_8_ = uStack_a18;
        auVar2._0_8_ = local_a20;
        local_b40._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * local_b40._0_16_;
        local_b40._16_16_ = ZEXT116(0) * auVar6._0_16_ + ZEXT116(1) * auVar2;
        auVar2 = vpinsrd_avx(ZEXT416(local_d04),local_d04 + 2,1);
        auVar2 = vpinsrd_avx(auVar2,local_d04 + 4,2);
        auVar2 = vpinsrd_avx(auVar2,local_d04 + 6,3);
        auVar3 = vpinsrd_avx(ZEXT416(local_d04 + 8),local_d04 + 10,1);
        auVar3 = vpinsrd_avx(auVar3,local_d04 + 0xc,2);
        auVar3 = vpinsrd_avx(auVar3,local_d04 + 0xe,3);
        local_1c0 = auVar2._0_8_;
        uStack_1b8 = auVar2._8_8_;
        uStack_1b0 = auVar3._0_8_;
        uStack_1a8 = auVar3._8_8_;
        local_c40 = local_1c0;
        uStack_c38 = uStack_1b8;
        uStack_c30 = uStack_1b0;
        uStack_c28 = uStack_1a8;
        local_91c = local_c64;
        auVar2 = vpinsrd_avx(ZEXT416(local_c64),local_c64,1);
        auVar2 = vpinsrd_avx(auVar2,local_c64,2);
        local_7e0 = vpinsrd_avx(auVar2,local_c64,3);
        auVar2 = vpinsrd_avx(ZEXT416(local_c64),local_c64,1);
        auVar2 = vpinsrd_avx(auVar2,local_c64,2);
        auStack_7d0 = vpinsrd_avx(auVar2,local_c64,3);
        auVar25._16_8_ = auStack_7d0._0_8_;
        auVar25._0_16_ = local_7e0;
        auVar25._24_8_ = auStack_7d0._8_8_;
        local_960 = vpslld_avx2(auVar25,ZEXT416(in_R8D));
        local_920 = 0x3f;
        auVar2 = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar2 = vpinsrd_avx(auVar2,0x3f,2);
        auVar2 = vpinsrd_avx(auVar2,0x3f,3);
        auVar3 = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar3 = vpinsrd_avx(auVar3,0x3f,2);
        auVar3 = vpinsrd_avx(auVar3,0x3f,3);
        local_980 = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
        auStack_970 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
        uStack_790 = auStack_970._0_8_;
        uStack_788 = auStack_970._8_8_;
        auVar8._16_8_ = uStack_790;
        auVar8._0_16_ = local_980;
        auVar8._24_8_ = uStack_788;
        auVar6 = vpand_avx2(local_960,auVar8);
        local_d00 = vpsrld_avx2(auVar6,ZEXT416(1));
      }
      local_c00 = vpsubd_avx2(local_b40,_local_b20);
      auVar6 = vpslld_avx2(_local_b20,ZEXT416(5));
      auVar26._16_8_ = auStack_850._0_8_;
      auVar26._0_16_ = auVar1;
      auVar26._24_8_ = auStack_850._8_8_;
      local_ba0 = vpaddd_avx2(auVar6,auVar26);
      local_ca0 = vpmulld_avx2(local_c00,local_d00);
      auVar6 = vpaddd_avx2(local_ba0,local_ca0);
      local_cc0 = vpsrld_avx2(auVar6,ZEXT416(5));
      local_a30 = local_cc0._16_8_;
      uStack_a28 = local_cc0._24_8_;
      auVar31._16_16_ = ZEXT416(5);
      auVar31._0_16_ = local_cc0._16_16_;
      auVar6 = vpackusdw_avx2(local_cc0,auVar31);
      auVar33._16_8_ = local_820._16_8_;
      auVar33._0_16_ = auVar40._0_16_;
      auVar33._24_8_ = local_820._24_8_;
      auVar32._8_8_ = uStack_c38;
      auVar32._0_8_ = local_c40;
      auVar32._16_8_ = uStack_c30;
      auVar32._24_8_ = uStack_c28;
      auVar7 = vpcmpgtd_avx2(auVar33,auVar32);
      local_c60._16_8_ = auVar7._16_8_;
      local_c60._24_8_ = auVar7._24_8_;
      local_a40 = local_c60._16_8_;
      uStack_a38 = local_c60._24_8_;
      auVar34._16_16_ = ZEXT416(5);
      auVar34._0_16_ = auVar7._16_16_;
      local_c60 = vpackssdw_avx2(auVar7,auVar34);
      auVar29._16_8_ = auStack_9f0._0_8_;
      auVar29._0_16_ = auVar4;
      auVar29._24_8_ = auStack_9f0._8_8_;
      local_ce0 = vpblendvb_avx2(auVar29,auVar6,local_c60);
      local_ac0 = local_ce0._0_8_;
      uStack_ab8 = local_ce0._8_8_;
      uStack_ab0 = local_ce0._16_8_;
      uStack_aa8 = local_ce0._24_8_;
      local_17d0[(long)local_c68 * 2] = local_ce0._0_8_;
      local_17d0[(long)local_c68 * 2 + 1] = local_ce0._8_8_;
      local_c64 = in_R9D + local_c64;
    }
  }
  for (local_17d4 = 0; local_17d4 < in_EDI; local_17d4 = local_17d4 + 1) {
    puVar38 = (undefined8 *)(in_RSI + in_RDX * local_17d4 * 2);
    uVar10 = local_17d0[(long)local_17d4 * 2 + 1];
    *puVar38 = local_17d0[(long)local_17d4 * 2];
    puVar38[1] = uVar10;
  }
  return;
}

Assistant:

static void highbd_dr_prediction_z1_8xN_avx2(int N, uint16_t *dst,
                                             ptrdiff_t stride,
                                             const uint16_t *above,
                                             int upsample_above, int dx,
                                             int bd) {
  __m128i dstvec[32];
  if (bd < 12) {
    highbd_dr_prediction_z1_8xN_internal_avx2(N, dstvec, above, upsample_above,
                                              dx);
  } else {
    highbd_dr_prediction_32bit_z1_8xN_internal_avx2(N, dstvec, above,
                                                    upsample_above, dx);
  }
  for (int i = 0; i < N; i++) {
    _mm_storeu_si128((__m128i *)(dst + stride * i), dstvec[i]);
  }
}